

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int proxy_conn_accept(proxy_conn_handle *pc,conn_handle *conn_client,char *callsign,
                     uint8_t reconnect_only)

{
  long *plVar1;
  int iVar2;
  char *pcVar3;
  char *local_60;
  int local_3c;
  int ret;
  proxy_conn_priv *priv;
  uint8_t reconnect_only_local;
  char *callsign_local;
  conn_handle *conn_client_local;
  proxy_conn_handle *pc_local;
  
  plVar1 = (long *)pc->priv;
  mutex_lock((mutex_handle *)(plVar1 + 0xd));
  if ((*plVar1 == 0) &&
     ((reconnect_only == '\0' || (iVar2 = strcmp((char *)(plVar1 + 0x21b),callsign), iVar2 == 0))))
  {
    strncpy((char *)(plVar1 + 0x21b),callsign,0xb);
    *plVar1 = (long)conn_client;
    mutex_unlock((mutex_handle *)(plVar1 + 0xd));
    local_3c = conn_listen((conn_handle *)(plVar1 + 1));
    if (local_3c < 0) {
      proxy_log(pc->ph,LOG_LEVEL_ERROR,"Failed to open UDP control port (5199). Dropping...\n");
    }
    else {
      local_3c = conn_listen((conn_handle *)(plVar1 + 5));
      if (local_3c < 0) {
        proxy_log(pc->ph,LOG_LEVEL_ERROR,"Failed to open UDP data port (5198). Dropping...\n");
      }
      else {
        local_3c = worker_wake((worker_handle *)(plVar1 + 0xf));
        if (local_3c < 0) {
          proxy_log(pc->ph,LOG_LEVEL_ERROR,"Failed to signal UDP control forwarder. Dropping...\n");
        }
        else {
          local_3c = worker_wake((worker_handle *)(plVar1 + 0x13));
          if (-1 < local_3c) {
            pcVar3 = "Connected";
            if (reconnect_only != '\0') {
              pcVar3 = "Reconnected";
            }
            if (pc->source_addr == (char *)0x0) {
              local_60 = "0.0.0.0";
            }
            else {
              local_60 = pc->source_addr;
            }
            proxy_log(pc->ph,LOG_LEVEL_INFO,
                      "%s to client \'%s\', using external interface \'%s\'.\n",pcVar3,
                      plVar1 + 0x21b,local_60);
            return 0;
          }
          proxy_log(pc->ph,LOG_LEVEL_ERROR,"Failed to signal UDP data forwarder. Dropping...\n");
        }
      }
    }
    proxy_conn_finish(pc);
    pc_local._4_4_ = local_3c;
  }
  else {
    mutex_unlock((mutex_handle *)(plVar1 + 0xd));
    pc_local._4_4_ = -0x10;
  }
  return pc_local._4_4_;
}

Assistant:

int proxy_conn_accept(struct proxy_conn_handle *pc,
		      struct conn_handle *conn_client,
		      const char *callsign,
		      uint8_t reconnect_only)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret = 0;

	mutex_lock(&priv->mutex_client);

	if (priv->conn_client != NULL ||
	    (reconnect_only && strcmp(priv->callsign, callsign) != 0)) {
		mutex_unlock(&priv->mutex_client);
		return -EBUSY;
	}

	strncpy(priv->callsign, callsign, sizeof(priv->callsign) - 1);
	priv->conn_client = conn_client;

	mutex_unlock(&priv->mutex_client);

	ret = conn_listen(&priv->conn_control);
	if (ret < 0) {
		proxy_log(pc->ph, LOG_LEVEL_ERROR,
			  "Failed to open UDP control port (5199). Dropping...\n");
		goto proxy_conn_accept_exit;
	}

	ret = conn_listen(&priv->conn_data);
	if (ret < 0) {
		proxy_log(pc->ph, LOG_LEVEL_ERROR,
			  "Failed to open UDP data port (5198). Dropping...\n");
		goto proxy_conn_accept_exit;
	}

	ret = worker_wake(&priv->worker_control);
	if (ret < 0) {
		proxy_log(pc->ph, LOG_LEVEL_ERROR,
			  "Failed to signal UDP control forwarder. Dropping...\n");
		goto proxy_conn_accept_exit;
	}

	ret = worker_wake(&priv->worker_data);
	if (ret < 0) {
		proxy_log(pc->ph, LOG_LEVEL_ERROR,
			  "Failed to signal UDP data forwarder. Dropping...\n");
		goto proxy_conn_accept_exit;
	}

	proxy_log(pc->ph, LOG_LEVEL_INFO,
		  "%s to client '%s', using external interface '%s'.\n",
		  reconnect_only ? "Reconnected" : "Connected", priv->callsign,
		  pc->source_addr == NULL ? "0.0.0.0" : pc->source_addr);

	return 0;

proxy_conn_accept_exit:
	proxy_conn_finish(pc);

	return ret;
}